

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O0

Promise<void> __thiscall
kj::HttpService::Response::sendError
          (Response *this,uint statusCode,StringPtr statusText,HttpHeaders *headers)

{
  AsyncOutputStream *pAVar1;
  char *pcVar2;
  size_t sVar3;
  PromiseNode *extraout_RDX;
  undefined4 in_register_00000034;
  undefined8 in_R9;
  Promise<void> PVar4;
  undefined1 local_90 [8];
  Promise<void> promise;
  size_t local_70;
  Maybe<unsigned_long> local_68;
  Response *local_58;
  HttpHeaders *pHStack_50;
  undefined1 local_48 [8];
  Own<kj::AsyncOutputStream> stream;
  HttpHeaders *headers_local;
  uint statusCode_local;
  Response *this_local;
  StringPtr statusText_local;
  
  local_58 = (Response *)statusText.content.size_;
  pHStack_50 = headers;
  this_local = local_58;
  statusText_local.content.ptr = (char *)headers;
  statusText_local.content.size_ = (size_t)this;
  local_70 = StringPtr::size((StringPtr *)&this_local);
  Maybe<unsigned_long>::Maybe(&local_68,&local_70);
  (*(code *)**(undefined8 **)CONCAT44(in_register_00000034,statusCode))
            (local_48,(undefined8 *)CONCAT44(in_register_00000034,statusCode),
             (int)statusText.content.ptr,local_58,pHStack_50,in_R9,&local_68);
  Maybe<unsigned_long>::~Maybe(&local_68);
  pAVar1 = Own<kj::AsyncOutputStream>::operator->((Own<kj::AsyncOutputStream> *)local_48);
  pcVar2 = StringPtr::begin((StringPtr *)&this_local);
  sVar3 = StringPtr::size((StringPtr *)&this_local);
  (**pAVar1->_vptr_AsyncOutputStream)(local_90,pAVar1,pcVar2,sVar3);
  mv<kj::Own<kj::AsyncOutputStream>>((Own<kj::AsyncOutputStream> *)local_48);
  Promise<void>::attach<kj::Own<kj::AsyncOutputStream>>
            ((Promise<void> *)this,(Own<kj::AsyncOutputStream> *)local_90);
  Promise<void>::~Promise((Promise<void> *)local_90);
  Own<kj::AsyncOutputStream>::~Own((Own<kj::AsyncOutputStream> *)local_48);
  PVar4.super_PromiseBase.node.ptr = extraout_RDX;
  PVar4.super_PromiseBase.node.disposer = (Disposer *)this;
  return (Promise<void>)PVar4.super_PromiseBase.node;
}

Assistant:

kj::Promise<void> HttpService::Response::sendError(
    uint statusCode, kj::StringPtr statusText, const HttpHeaders& headers) {
  auto stream = send(statusCode, statusText, headers, statusText.size());
  auto promise = stream->write(statusText.begin(), statusText.size());
  return promise.attach(kj::mv(stream));
}